

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O2

void advance_level(CHAR_DATA *ch,bool hide)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  CClass *pCVar11;
  PC_DATA *pPVar12;
  char *pcVar13;
  char *pcVar14;
  short *psVar15;
  long lVar16;
  short sVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  char buf [4608];
  
  bVar5 = is_npc(ch);
  if (!bVar5) {
    ch->pcdata->last_level = (((int)current_time - (int)ch->logon) + ch->played) / 0xe10;
    pCVar11 = char_data::Class(ch);
    iVar6 = CClass::GetIndex(pCVar11);
    sprintf(buf,"the %s",title_table[iVar6][ch->level][ch->sex == 2]);
    set_title(ch,buf);
    get_curr_stat(ch,1);
    get_curr_stat(ch,2);
    iVar6 = get_curr_stat(ch,4);
    iVar7 = get_curr_stat(ch,3);
    iVar8 = get_curr_stat(ch,4);
    iVar9 = get_curr_stat(ch,3);
    uVar10 = number_range((iVar7 + iVar6) / 5,(iVar9 + iVar8) / 3);
    iVar6 = get_curr_stat(ch,2);
    sVar1 = wis_app[iVar6].practice;
    iVar7 = get_curr_stat(ch,4);
    pCVar11 = char_data::Class(ch);
    iVar6 = pCVar11->gainconst;
    iVar8 = number_range(-1,2);
    uVar19 = (uint)((double)iVar8 + (double)iVar6 * 1.3333 + (double)iVar7 * 0.5333 + -1.3333);
    iVar6 = get_curr_stat(ch,4);
    if (0x17 < iVar6) {
      iVar6 = get_curr_stat(ch,4);
      uVar19 = (uVar19 + iVar6) - 0x17;
    }
    iVar7 = get_curr_stat(ch,1);
    pCVar11 = char_data::Class(ch);
    iVar6 = pCVar11->gainconst;
    iVar8 = number_range(-1,2);
    pCVar11 = char_data::Class(ch);
    iVar9 = CClass::GetIndex(pCVar11);
    if (iVar9 == 1) {
      iVar9 = number_percent();
      uVar19 = uVar19 + (0x4b < iVar9);
    }
    uVar20 = (uint)((double)iVar8 + (double)iVar6 * -2.0833 + (double)iVar7 * 0.5667 + 8.0278);
    pCVar11 = char_data::Class(ch);
    iVar6 = CClass::GetIndex(pCVar11);
    if (iVar6 == 10) {
      iVar6 = number_range(2,5);
      uVar20 = uVar20 - iVar6;
    }
    pCVar11 = char_data::Class(ch);
    iVar6 = CClass::GetIndex(pCVar11);
    if (iVar6 == 0xb) {
      iVar6 = number_range(1,2);
      uVar20 = uVar20 - iVar6;
    }
    uVar18 = 6;
    if (6 < (int)uVar10) {
      uVar18 = (ulong)uVar10;
    }
    ch->max_hit = ch->max_hit + (short)uVar19;
    ch->max_mana = ch->max_mana + (short)uVar20;
    ch->max_move = ch->max_move + (short)uVar18;
    ch->practice = ch->practice + sVar1;
    if (ch->level % 5 == 0) {
      ch->train = ch->train + 1;
    }
    pCVar11 = char_data::Class(ch);
    iVar6 = CClass::GetIndex(pCVar11);
    if (iVar6 == 1) {
      pPVar12 = ch->pcdata;
      if (ch->level % 0x14 == 0) {
        pPVar12->special = pPVar12->special + 1;
      }
    }
    else {
      pPVar12 = ch->pcdata;
    }
    pPVar12->perm_hit = pPVar12->perm_hit + (short)uVar19;
    pPVar12->perm_mana = pPVar12->perm_mana + (short)uVar20;
    pPVar12->perm_move = pPVar12->perm_move + (short)uVar18;
    psVar15 = &skill_table[0].ctype;
    for (lVar16 = 0; lVar16 != 800; lVar16 = lVar16 + 1) {
      if ((10 < pPVar12->learned[lVar16]) && (*psVar15 != 3)) {
        sVar17 = pPVar12->learned[lVar16] + 1;
        if (99 < sVar17) {
          sVar17 = 100;
        }
        pPVar12->learned[lVar16] = sVar17;
      }
      psVar15 = psVar15 + 0x30;
    }
    for (lVar16 = 0x16; lVar16 != 0x7a; lVar16 = lVar16 + 1) {
      pPVar12 = (&ch->pcdata->next)[lVar16];
      if ((pPVar12 != (PC_DATA *)0x0) && (*(char *)&pPVar12->next != '\0')) {
        free_pstring((char *)pPVar12);
        (&ch->pcdata->next)[lVar16] = (PC_DATA *)0x0;
      }
    }
    if (!hide) {
      pcVar13 = get_char_color(ch,"lightgreen");
      sVar17 = ch->max_hit;
      sVar2 = ch->max_mana;
      sVar3 = ch->max_move;
      sVar4 = ch->practice;
      pcVar14 = END_COLOR(ch);
      sprintf(buf,"%sYou gain %d/%d hp, %d/%d mana, %d/%d move, and %d/%d practices.%s\n\r",pcVar13,
              (ulong)uVar19,(ulong)(uint)(int)sVar17,(ulong)uVar20,(ulong)(uint)(int)sVar2,uVar18,
              (ulong)(uint)(int)sVar3,(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar4,pcVar14);
      send_to_char(buf,ch);
    }
    save_char_obj(ch);
  }
  return;
}

Assistant:

void advance_level(CHAR_DATA *ch, bool hide)
{
	char buf[MAX_STRING_LENGTH];
	float tmp;
	int add_hp;
	int add_mana;
	int add_move;
	int add_prac;
	int int_mod;
	int sn;
	int i;
	int wis_mod;

	if (is_npc(ch))
		return;

	ch->pcdata->last_level = (ch->played + (int)(current_time - ch->logon)) / 3600;

	sprintf(buf, "the %s", title_table[ch->Class()->GetIndex()][ch->level][ch->sex == SEX_FEMALE ? 1 : 0]);
	set_title(ch, buf);

	int_mod = get_curr_stat(ch, STAT_INT) - 2;
	wis_mod = get_curr_stat(ch, STAT_WIS) - 2;
	add_move = number_range(
		(get_curr_stat(ch, STAT_CON) + get_curr_stat(ch, STAT_DEX)) / 5,
		(get_curr_stat(ch, STAT_CON) + get_curr_stat(ch, STAT_DEX)) / 3);
	add_prac = wis_app[get_curr_stat(ch, STAT_WIS)].practice;

	tmp = -1.3333 + .5333 * get_curr_stat(ch, STAT_CON) + 1.3333 * ch->Class()->gainconst + number_range(-1, 2);
	add_hp = (int)tmp;

	if (get_curr_stat(ch, STAT_CON) >= 24)
		add_hp += get_curr_stat(ch, STAT_CON) - 23;

	tmp = 8.0278 + 0.5667 * get_curr_stat(ch, STAT_INT) - 2.0833 * ch->Class()->gainconst + number_range(-1, 2);
	add_mana = (int)tmp;

	if (ch->Class()->GetIndex() == CLASS_WARRIOR && number_percent() > 75)
		add_hp += 1;

	if (ch->Class()->GetIndex() == CLASS_NECROMANCER)
		add_mana -= number_range(2, 5);

	if (ch->Class()->GetIndex() == CLASS_SORCERER)
		add_mana -= number_range(1, 2);

	add_move = std::max(6, add_move);

	ch->max_hit += add_hp;
	ch->max_mana += add_mana;
	ch->max_move += add_move;
	ch->practice += add_prac;

	if (ch->level % 5 == 0)
		ch->train += 1;

	if (ch->Class()->GetIndex() == CLASS_WARRIOR && ch->level % 20 == 0)
		ch->pcdata->special++;

	ch->pcdata->perm_hit += add_hp;
	ch->pcdata->perm_mana += add_mana;
	ch->pcdata->perm_move += add_move;

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (ch->pcdata->learned[sn] > 10 && skill_table[sn].ctype != CMD_POWER)
		{
			ch->pcdata->learned[sn]++;
			ch->pcdata->learned[sn] = std::min((int)ch->pcdata->learned[sn], 100);
		}
	}

	for (i = 0; i < 100; i++)
	{
		if (ch->pcdata->recentkills[i]
			&& ch->pcdata->recentkills[i][0] != '\0'
			&& strcmp(ch->pcdata->recentkills[i], ""))
		{
			free_pstring(ch->pcdata->recentkills[i]);
			ch->pcdata->recentkills[i] = nullptr;
		}
	}

	if (!hide)
	{
		sprintf(buf, "%sYou gain %d/%d hp, %d/%d mana, %d/%d move, and %d/%d practices.%s\n\r",
			get_char_color(ch, "lightgreen"),
			add_hp,
			ch->max_hit,
			add_mana,
			ch->max_mana,
			add_move,
			ch->max_move,
			add_prac,
			ch->practice,
			END_COLOR(ch));
		send_to_char(buf, ch);
	}

	save_char_obj(ch);
}